

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O0

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int r;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x44,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x47,"r == 0");
    abort();
  }
  iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x49,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x4c,"r == 0");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x4e,"close_cb_called == 2");
    abort();
  }
  if (connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x4f,"connect_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
            ,0x51,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 2);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}